

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

Sink * __thiscall jbcoin::Logs::get(Logs *this,string *name)

{
  Sink *pSVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_>_>_>,_bool>
  pVar2;
  _Head_base<0UL,_beast::Journal::Sink_*,_false> local_20;
  
  std::mutex::lock(&this->mutex_);
  (*this->_vptr_Logs[2])(&local_20,this,name,(ulong)this->thresh_);
  pVar2 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<beast::Journal::Sink,std::default_delete<beast::Journal::Sink>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<beast::Journal::Sink,std::default_delete<beast::Journal::Sink>>>>,beast::iless,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<beast::Journal::Sink,std::default_delete<beast::Journal::Sink>>>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,std::unique_ptr<beast::Journal::Sink,std::default_delete<beast::Journal::Sink>>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<beast::Journal::Sink,std::default_delete<beast::Journal::Sink>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<beast::Journal::Sink,std::default_delete<beast::Journal::Sink>>>>,beast::iless,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<beast::Journal::Sink,std::default_delete<beast::Journal::Sink>>>>>
                      *)&this->sinks_,name,
                     (unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_> *
                     )&local_20);
  if (local_20._M_head_impl != (Sink *)0x0) {
    (*(local_20._M_head_impl)->_vptr_Sink[1])();
  }
  pSVar1 = *(Sink **)(pVar2.first._M_node._M_node + 2);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return pSVar1;
}

Assistant:

beast::Journal::Sink&
Logs::get (std::string const& name)
{
    std::lock_guard <std::mutex> lock (mutex_);
    auto const result =
        sinks_.emplace(name, makeSink(name, thresh_));
    return *result.first->second;
}